

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O2

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  jpeg_entropy_encoder *pjVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  _func_void_j_compress_ptr *p_Var13;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar5 = *(uint *)&pjVar2[4].start_pass;
    if (uVar5 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      uVar5 = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar2[4].start_pass = uVar5 - 1;
  }
  paJVar3 = *MCU_data;
  iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
  uVar5 = cinfo->Se;
  for (uVar6 = (ulong)uVar5; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    uVar8 = (uint)(*paJVar3)[jpeg_natural_order[uVar6]];
    if ((*paJVar3)[jpeg_natural_order[uVar6]] < 0) {
      uVar8 = -uVar8;
    }
    if (uVar8 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_00130cb1;
  }
  uVar6 = (ulong)((int)uVar5 >> 0x1f & uVar5);
LAB_00130cb1:
  uVar5 = (uint)uVar6;
  for (uVar6 = uVar6 & 0xffffffff; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    uVar8 = (uint)(*paJVar3)[jpeg_natural_order[uVar6]];
    if ((*paJVar3)[jpeg_natural_order[uVar6]] < 0) {
      uVar8 = -uVar8;
    }
    if (uVar8 >> ((byte)cinfo->Ah & 0x1f) != 0) goto LAB_00130ce8;
  }
  uVar6 = (ulong)((int)uVar5 >> 0x1f & uVar5);
LAB_00130ce8:
  iVar12 = cinfo->Ss;
LAB_00130d04:
  if ((int)uVar5 < iVar12) {
    if (iVar12 <= cinfo->Se) {
      arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + (iVar12 * 3 + -3)),1);
    }
    return 1;
  }
  p_Var13 = (&pjVar2[9].finish_pass)[iVar1];
  lVar10 = (long)(iVar12 * 3 + -3);
  if ((int)uVar6 < iVar12) {
    arith_encode(cinfo,(uchar *)(p_Var13 + lVar10),0);
  }
  piVar11 = jpeg_natural_order + iVar12;
  p_Var13 = p_Var13 + lVar10 + 1;
  do {
    iVar12 = iVar12 + 1;
    uVar8 = (uint)(*paJVar3)[*piVar11];
    pjVar9 = pjVar2 + 0xf;
    if ((*paJVar3)[*piVar11] < 0) {
      uVar7 = -uVar8 >> ((byte)cinfo->Al & 0x1f);
      if ((short)uVar7 != 0) {
        if ((uVar7 & 0xffff) != 1) goto LAB_00130dda;
        uVar7 = 1;
        arith_encode(cinfo,(uchar *)p_Var13,1);
        goto LAB_00130de6;
      }
    }
    else {
      bVar4 = (byte)cinfo->Al & 0x1f;
      uVar7 = uVar8 >> bVar4;
      if (uVar8 >> bVar4 != 0) break;
    }
    arith_encode(cinfo,(uchar *)p_Var13,0);
    piVar11 = piVar11 + 1;
    p_Var13 = p_Var13 + 3;
  } while( true );
  if (uVar7 == 1) {
    arith_encode(cinfo,(uchar *)p_Var13,1);
    uVar7 = 0;
  }
  else {
LAB_00130dda:
    uVar7 = uVar7 & 1;
    pjVar9 = (jpeg_entropy_encoder *)(p_Var13 + 1);
  }
LAB_00130de6:
  arith_encode(cinfo,(uchar *)pjVar9,uVar7);
  goto LAB_00130d04;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, r, idx;
  char *BR_buffer;
  unsigned int BR;
  int Sl = cinfo->Se - cinfo->Ss + 1;
  int Al = cinfo->Al;
  JCOEF absvalues_unaligned[DCTSIZE2 + 15];
  JCOEF *absvalues;
  const JCOEF *cabsvalue, *EOBPTR;
  size_t zerobits, signbits;
  size_t bits[16 / SIZEOF_SIZE_T];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

#ifdef WITH_SIMD
  cabsvalue = absvalues = (JCOEF *)PAD((JUINTPTR)absvalues_unaligned, 16);
#else
  /* Not using SIMD, so alignment is not needed */
  cabsvalue = absvalues = absvalues_unaligned;
#endif

  /* Prepare data */
  EOBPTR = absvalues +
    entropy->AC_refine_prepare(MCU_data[0][0], jpeg_natural_order + cinfo->Ss,
                               Sl, Al, absvalues, bits);

  /* Encode the AC coefficients per section G.1.2.3, fig. G.7 */

  r = 0;                        /* r = run length of zeros */
  BR = 0;                       /* BR = count of buffered bits added now */
  BR_buffer = entropy->bit_buffer + entropy->BE; /* Append bits to buffer */

  zerobits = bits[0];
#if SIZEOF_SIZE_T == 8
  signbits = bits[1];
#else
  signbits = bits[2];
#endif
  ENCODE_COEFS_AC_REFINE((void)0;);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[1];
  signbits = bits[3];

  if (zerobits) {
    int diff = ((absvalues + DCTSIZE2 / 2) - cabsvalue);
    idx = count_zeroes(&zerobits);
    signbits >>= idx;
    idx += diff;
    r += idx;
    cabsvalue += idx;
    goto first_iter_ac_refine;
  }

  ENCODE_COEFS_AC_REFINE(first_iter_ac_refine:);
#endif

  r |= (int)((absvalues + Sl) - cabsvalue);

  if (r > 0 || BR > 0) {        /* If there are trailing zeroes, */
    entropy->EOBRUN++;          /* count an EOB */
    entropy->BE += BR;          /* concat my correction bits to older ones */
    /* We force out the EOB if we risk either:
     * 1. overflow of the EOB counter;
     * 2. overflow of the correction bit buffer during the next MCU.
     */
    if (entropy->EOBRUN == 0x7FFF ||
        entropy->BE > (MAX_CORR_BITS - DCTSIZE2 + 1))
      emit_eobrun(entropy);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}